

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

VertexAlignment *
s2polyline_alignment::GetExactVertexAlignment
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b)

{
  ostream *poVar1;
  size_type __n;
  allocator<s2polyline_alignment::ColumnStride> local_b1;
  value_type local_b0;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  local_a8;
  undefined1 local_90 [8];
  Window w;
  S2LogMessage local_68;
  S2LogMessageVoidify local_55 [20];
  byte local_41;
  S2LogMessage local_40;
  S2LogMessageVoidify local_29;
  int local_28;
  int local_24;
  int b_n;
  int a_n;
  S2Polyline *b_local;
  S2Polyline *a_local;
  
  _b_n = b;
  b_local = a;
  a_local = (S2Polyline *)__return_storage_ptr__;
  local_24 = S2Polyline::num_vertices(a);
  local_28 = S2Polyline::num_vertices(_b_n);
  local_41 = 0;
  if (local_24 < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11b,kFatal,(ostream *)&std::cerr);
    local_41 = 1;
    poVar1 = S2LogMessage::stream(&local_40);
    poVar1 = std::operator<<(poVar1,"Check failed: a_n > 0 ");
    poVar1 = std::operator<<(poVar1,"A is empty polyline.");
    S2LogMessageVoidify::operator&(&local_29,poVar1);
  }
  if ((local_41 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_40);
  }
  w.strides_.
  super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  if (local_28 < 1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11c,kFatal,(ostream *)&std::cerr);
    w.strides_.
    super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    poVar1 = S2LogMessage::stream(&local_68);
    poVar1 = std::operator<<(poVar1,"Check failed: b_n > 0 ");
    poVar1 = std::operator<<(poVar1,"B is empty polyline.");
    S2LogMessageVoidify::operator&(local_55,poVar1);
  }
  if ((w.strides_.
       super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_68);
  }
  __n = (size_type)local_24;
  local_b0.start = 0;
  local_b0.end = local_28;
  std::allocator<s2polyline_alignment::ColumnStride>::allocator(&local_b1);
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  vector(&local_a8,__n,&local_b0,&local_b1);
  Window::Window((Window *)local_90,&local_a8);
  std::
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>::
  ~vector(&local_a8);
  std::allocator<s2polyline_alignment::ColumnStride>::~allocator(&local_b1);
  DynamicTimewarp(__return_storage_ptr__,b_local,_b_n,(Window *)local_90);
  Window::~Window((Window *)local_90);
  return __return_storage_ptr__;
}

Assistant:

VertexAlignment GetExactVertexAlignment(const S2Polyline& a,
                                        const S2Polyline& b) {
  const int a_n = a.num_vertices();
  const int b_n = b.num_vertices();
  S2_CHECK(a_n > 0) << "A is empty polyline.";
  S2_CHECK(b_n > 0) << "B is empty polyline.";
  const auto w = Window(std::vector<ColumnStride>(a_n, {0, b_n}));
  return DynamicTimewarp(a, b, w);
}